

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_setop_node.cpp
# Opt level: O1

unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> __thiscall
duckdb::Binder::BindNode(Binder *this,SetOperationNode *statement)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar1;
  SetOperationType SVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> _Var4;
  pointer pLVar5;
  pointer pLVar6;
  pointer puVar7;
  pointer pcVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  BoundQueryNode *pBVar11;
  BaseExpression *pBVar12;
  _Head_base<0UL,_duckdb::BoundSetOperationNode_*,_false> _Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  pointer pBVar18;
  idx_t iVar19;
  Binder *pBVar20;
  pointer pBVar21;
  type pBVar22;
  type pBVar23;
  reference pvVar24;
  iterator iVar25;
  mapped_type *pmVar26;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  _Var27;
  LogicalType *pLVar28;
  reference pvVar29;
  undefined8 extraout_RAX;
  reference pvVar30;
  iterator iVar31;
  reference pvVar32;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var33;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  type pBVar34;
  pointer pBVar35;
  BinderException *pBVar36;
  vector<duckdb::LogicalType,_true> *pvVar37;
  QueryNode *in_RDX;
  idx_t i;
  ulong __n;
  pointer *__ptr;
  vector<duckdb::LogicalType,_true> *pvVar38;
  pointer prVar39;
  vector<unsigned_long,_true> *this_00;
  __node_base _Var40;
  size_type sVar41;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *__n_00;
  pointer pCVar42;
  ColumnBinding binding;
  ColumnBinding binding_00;
  ColumnBinding binding_01;
  ColumnBinding binding_02;
  templated_unique_single_t result;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> right_reorder_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> left_reorder_expr;
  OrderBinder order_binder;
  case_insensitive_map_t<idx_t> left_names_map;
  SelectBindState bind_state;
  case_insensitive_map_t<idx_t> right_names_map;
  _Head_base<0UL,_duckdb::BoundSetOperationNode_*,_false> local_388;
  optional_ptr<duckdb::Binder,_true> local_380;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_378;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_370;
  type local_368;
  type local_360;
  type local_358;
  vector<duckdb::LogicalType,_true> *local_350;
  size_type local_348;
  QueryNode *local_340;
  vector<duckdb::LogicalType,_true> *local_338;
  vector<duckdb::LogicalType,_true> *local_330;
  undefined1 local_328 [56];
  undefined1 local_2f0 [24];
  vector<unsigned_long,_true> local_2d8;
  vector<unsigned_long,_true> local_2b8;
  size_type local_298;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_288;
  __uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> local_270;
  vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  local_268;
  undefined8 uStack_250;
  undefined4 local_248;
  undefined8 local_240;
  reference_wrapper<duckdb::Binder> arStack_238 [2];
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  undefined1 auStack_1f8 [16];
  ClientContext *local_1e8;
  __node_base local_1e0;
  __buckets_ptr pp_Stack_1d8;
  float local_1d0;
  __node_base local_1c8;
  undefined1 auStack_1c0 [8];
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_1b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1a0;
  undefined1 local_168 [56];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_130;
  pointer local_f8;
  pointer puStack_f0;
  __node_base local_e8;
  pointer local_c0;
  __node_base local_b8;
  vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  local_b0;
  LogicalType local_98;
  LogicalType local_80;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  __node_base _Stack_50;
  undefined4 local_48;
  __node_base_ptr local_40;
  element_type *peStack_38;
  
  local_380.ptr = (Binder *)statement;
  local_270._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl =
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)this;
  local_388._M_head_impl = (BoundSetOperationNode *)operator_new(0xf8);
  *(undefined1 *)
   &(((element_type *)local_388._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = 2;
  ((element_type *)local_388._M_head_impl)->context = (ClientContext *)0x0;
  (((element_type *)local_388._M_head_impl)->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)0x0;
  (((element_type *)local_388._M_head_impl)->CTE_bindings)._M_h._M_bucket_count = 0;
  (((element_type *)local_388._M_head_impl)->CTE_bindings)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (((element_type *)local_388._M_head_impl)->CTE_bindings)._M_h._M_element_count = 0;
  *(undefined8 *)
   &(((element_type *)local_388._M_head_impl)->CTE_bindings)._M_h._M_rehash_policy.
    _M_max_load_factor = 0;
  (((element_type *)local_388._M_head_impl)->CTE_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (((element_type *)local_388._M_head_impl)->CTE_bindings)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((element_type *)local_388._M_head_impl)->bound_ctes)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined ***)
   &(((element_type *)local_388._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__BoundSetOperationNode_019cb398;
  *(undefined2 *)&(((element_type *)local_388._M_head_impl)->bound_ctes)._M_h._M_bucket_count = 0;
  (((element_type *)local_388._M_head_impl)->bound_ctes)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (((element_type *)local_388._M_head_impl)->bound_ctes)._M_h._M_element_count = 0;
  (((element_type *)local_388._M_head_impl)->bound_ctes)._M_h._M_rehash_policy._M_next_resize = 0;
  (((element_type *)local_388._M_head_impl)->bound_ctes)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((element_type *)local_388._M_head_impl)->bind_context).cte_references._M_h._M_buckets =
       (__buckets_ptr)0x0;
  (((element_type *)local_388._M_head_impl)->bind_context).cte_references._M_h._M_bucket_count = 0;
  (((element_type *)local_388._M_head_impl)->bind_context).cte_references._M_h._M_before_begin.
  _M_nxt = (_Hash_node_base *)0x0;
  (((element_type *)local_388._M_head_impl)->bind_context).cte_references._M_h._M_element_count = 0;
  *(undefined8 *)
   &(((element_type *)local_388._M_head_impl)->bind_context).cte_references._M_h._M_rehash_policy.
    _M_max_load_factor = 0;
  (((element_type *)local_388._M_head_impl)->bind_context).cte_references._M_h._M_rehash_policy.
  _M_next_resize = 0;
  (((element_type *)local_388._M_head_impl)->bind_context).cte_references._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((element_type *)local_388._M_head_impl)->bind_context).binder = (Binder *)0x0;
  *(undefined8 *)
   &(((element_type *)local_388._M_head_impl)->bind_context).bindings_list.
    super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       = 0;
  (((element_type *)local_388._M_head_impl)->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((element_type *)local_388._M_head_impl)->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((element_type *)local_388._M_head_impl)->bind_context).using_columns._M_h._M_buckets =
       (__buckets_ptr)0x0;
  (((element_type *)local_388._M_head_impl)->bind_context).using_columns._M_h._M_bucket_count = 0;
  (((element_type *)local_388._M_head_impl)->bind_context).using_columns._M_h._M_before_begin._M_nxt
       = (_Hash_node_base *)0x0;
  SVar2 = *(SetOperationType *)&in_RDX[1]._vptr_QueryNode;
  local_340 = in_RDX;
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar18->setop_type = SVar2;
  bVar16 = *(bool *)((long)&local_340[1]._vptr_QueryNode + 1);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar18->setop_all = bVar16;
  iVar19 = GenerateTableIndex(local_380.ptr);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar18->setop_index = iVar19;
  CreateBinder((Binder *)local_228,(local_380.ptr)->context,local_380,REGULAR_BINDER);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  uVar15 = local_228._8_8_;
  uVar14 = local_228._0_8_;
  local_228._0_8_ = (element_type *)0x0;
  local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (pBVar18->left_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar18->left_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar14;
  (pBVar18->left_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar15;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
  }
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar20 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar18->left_binder);
  pBVar20->can_contain_nulls = true;
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar20 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar18->left_binder);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_340[1].type);
  BindNode((Binder *)local_228,(QueryNode *)pBVar20);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  uVar14 = local_228._0_8_;
  local_228._0_8_ = (element_type *)0x0;
  _Var4._M_head_impl =
       (pBVar18->left).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar18->left).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)uVar14;
  if (_Var4._M_head_impl != (BoundQueryNode *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_BoundQueryNode + 8))();
  }
  if ((element_type *)local_228._0_8_ != (element_type *)0x0) {
    (**(code **)(*(long *)local_228._0_8_ + 8))();
  }
  CreateBinder((Binder *)local_228,(local_380.ptr)->context,local_380,REGULAR_BINDER);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  uVar15 = local_228._8_8_;
  uVar14 = local_228._0_8_;
  local_228._0_8_ = (element_type *)0x0;
  local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (pBVar18->right_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar18->right_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar14;
  (pBVar18->right_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar15;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
  }
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar20 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar18->right_binder);
  pBVar20->can_contain_nulls = true;
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar20 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar18->right_binder);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_340[1].modifiers);
  BindNode((Binder *)local_228,(QueryNode *)pBVar20);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  uVar14 = local_228._0_8_;
  local_228._0_8_ = (element_type *)0x0;
  _Var4._M_head_impl =
       (pBVar18->right).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar18->right).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)uVar14;
  if (_Var4._M_head_impl != (BoundQueryNode *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_BoundQueryNode + 8))();
  }
  if ((element_type *)local_228._0_8_ != (element_type *)0x0) {
    (**(code **)(*(long *)local_228._0_8_ + 8))();
  }
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
            operator->(&pBVar18->left);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pBVar18->super_BoundQueryNode).names,
              &(pBVar21->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar22 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar18->left_binder);
  MoveCorrelatedExpressions(local_380.ptr,pBVar22);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar22 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar18->right_binder);
  MoveCorrelatedExpressions(local_380.ptr,pBVar22);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  if (pBVar18->setop_type != UNION_BY_NAME) {
    pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_388);
    pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar18->left);
    pLVar5 = (pBVar21->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar6 = (pBVar21->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_388);
    pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar18->right);
    if ((long)pLVar5 - (long)pLVar6 !=
        (long)(pBVar21->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pBVar21->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) {
      pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
      local_228._0_8_ = local_218;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_228,
                 "Set operations can only apply to expressions with the same number of result columns"
                 ,"");
      BinderException::BinderException(pBVar36,(string *)local_228);
      __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  if (pBVar18->setop_type == UNION_BY_NAME) {
    pBVar23 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                           *)&local_388);
    local_348 = CONCAT71(local_348._1_7_,(local_380.ptr)->can_contain_nulls);
    local_268.
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_start = arStack_238;
    local_268.
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
    local_268.
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uStack_250 = 0;
    local_248 = 0x3f800000;
    local_240 = 0;
    arStack_238[0]._M_data = (Binder *)0x0;
    local_68.ptr = (vector<duckdb::DummyBinding,_true> *)&peStack_38;
    local_60._M_allocated_capacity = (size_type)&DAT_00000001;
    local_60._8_8_ = 0;
    _Stack_50._M_nxt = (_Hash_node_base *)0x0;
    local_48 = 0x3f800000;
    local_40 = (__node_base_ptr)0x0;
    peStack_38 = (element_type *)0x0;
    local_360 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar23->left);
    local_368 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar23->right);
    if ((local_360->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_360->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = &local_360->names;
      sVar41 = 0;
      do {
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        iVar25 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_268,pvVar24);
        if (iVar25.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
          local_228._0_8_ = local_218;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,
                     "UNION (ALL) BY NAME operation doesn\'t support duplicate names in the SELECT list - the name \"%s\" occurs multiple times in the left-hand side"
                     ,"");
          pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](pvVar1,sVar41);
          local_328._0_8_ = local_328 + 0x10;
          pcVar8 = (pvVar24->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_328,pcVar8,pcVar8 + pvVar24->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar36,(string *)local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
          __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        pmVar26 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&local_268,pvVar24);
        *pmVar26 = sVar41;
        sVar41 = sVar41 + 1;
      } while (sVar41 < (ulong)((long)(local_360->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_360->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_358 = pBVar23;
    if ((local_368->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_368->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = &local_368->names;
      sVar41 = 0;
      do {
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        iVar25 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_68,pvVar24);
        if (iVar25.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
          local_228._0_8_ = local_218;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,
                     "UNION (ALL) BY NAME operation doesn\'t support duplicate names in the SELECT list - the name \"%s\" occurs multiple times in the right-hand side"
                     ,"");
          pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](pvVar1,sVar41);
          local_328._0_8_ = local_328 + 0x10;
          pcVar8 = (pvVar24->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_328,pcVar8,pcVar8 + pvVar24->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar36,(string *)local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
          __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        iVar25 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_268,pvVar24);
        if (iVar25.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](pvVar1,sVar41);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&(pBVar23->super_BoundQueryNode).names,pvVar24);
        }
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        pmVar26 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&local_68,pvVar24);
        *pmVar26 = sVar41;
        sVar41 = sVar41 + 1;
      } while (sVar41 < (ulong)((long)(local_368->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_368->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    _Var40._M_nxt =
         (_Hash_node_base *)
         (local_358->super_BoundQueryNode).names.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pCVar42 = (pointer)(local_358->super_BoundQueryNode).names.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b8,
               (long)(local_360->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_360->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_228);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2d8,
               (long)(local_368->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_368->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_228);
    local_288 = &(local_358->super_BoundQueryNode).names;
    local_298 = (long)pCVar42 - (long)_Var40._M_nxt >> 5;
    if (pCVar42 == (pointer)_Var40._M_nxt) {
      pvVar38 = (vector<duckdb::LogicalType,_true> *)0x0;
    }
    else {
      local_330 = &local_360->types;
      pvVar37 = &local_368->types;
      pBVar11 = &local_358->super_BoundQueryNode;
      local_290 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                   *)(local_298 + (local_298 == 0));
      __n_00 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)0x0;
      local_350 = (vector<duckdb::LogicalType,_true> *)0x0;
      local_338 = pvVar37;
      local_c0 = pCVar42;
      local_b8._M_nxt = _Var40._M_nxt;
      do {
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_288,(size_type)__n_00);
        iVar25 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_268,pvVar24);
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_288,(size_type)__n_00);
        _Var27._M_cur =
             (__node_type *)
             ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&local_68,pvVar24);
        LogicalType::LogicalType((LogicalType *)local_228);
        pvVar37 = (vector<duckdb::LogicalType,_true> *)((ulong)pvVar37 & 0xffffffffffffff00);
        if (_Var27._M_cur == (__node_type *)0x0 ||
            iVar25.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (iVar25.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            pLVar28 = vector<duckdb::LogicalType,_true>::operator[]
                                (local_338,*(size_type *)((long)_Var27._M_cur + 0x28));
            this_00 = &local_2d8;
          }
          else {
            pLVar28 = vector<duckdb::LogicalType,_true>::operator[]
                                (local_330,
                                 *(size_type *)
                                  ((long)iVar25.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                         ._M_cur + 0x28));
            this_00 = &local_2b8;
            _Var27 = iVar25.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                     ._M_cur;
          }
          uVar14 = local_228._0_8_;
          if ((LogicalType *)local_228 != pLVar28) {
            uVar9 = pLVar28->id_;
            uVar10 = pLVar28->physical_type_;
            local_228[1] = uVar10;
            local_228[0] = uVar9;
            pvVar37 = (vector<duckdb::LogicalType,_true> *)((ulong)pvVar37 & 0xffffffffffffff00);
            local_228._2_6_ = SUB86(uVar14,2);
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_228 + 8),
                       &pLVar28->type_info_);
          }
          pvVar30 = vector<unsigned_long,_true>::operator[]
                              (this_00,*(size_type *)
                                        ((long)&((_Var27._M_cur)->
                                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                ).
                                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                                                ._M_storage._M_storage + 0x20));
          pvVar37 = (vector<duckdb::LogicalType,_true> *)CONCAT71((int7)((ulong)pvVar37 >> 8),1);
          local_350 = pvVar37;
        }
        else {
          pvVar32 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_330,
                               *(size_type *)
                                ((long)iVar25.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          pvVar29 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_338,*(size_type *)((long)_Var27._M_cur + 0x28));
          LogicalType::ForceMaxLogicalType((LogicalType *)local_328,pvVar32,pvVar29);
          uVar15 = local_218._0_8_;
          uVar14 = local_228._8_8_;
          local_228._0_2_ = local_328._0_2_;
          local_218._0_8_ = local_328._16_8_;
          local_228._8_8_ = local_328._8_8_;
          local_328._16_8_ = uVar15;
          local_328._8_8_ = uVar14;
          LogicalType::~LogicalType((LogicalType *)local_328);
          if ((__n_00 != *(vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                           **)((long)iVar25.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                     ._M_cur + 0x28)) ||
             (__n_00 != *(vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          **)((long)_Var27._M_cur + 0x28))) {
            local_350 = (vector<duckdb::LogicalType,_true> *)
                        CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          pvVar30 = vector<unsigned_long,_true>::operator[]
                              (&local_2b8,
                               (size_type)
                               *(vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                                 **)((long)iVar25.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                           ._M_cur + 0x28));
          *pvVar30 = (value_type)__n_00;
          pvVar30 = vector<unsigned_long,_true>::operator[]
                              (&local_2d8,*(size_type *)((long)_Var27._M_cur + 0x28));
        }
        *pvVar30 = (value_type)__n_00;
        if (((char)local_348 == '\0') &&
           (bVar16 = ExpressionBinder::ContainsNullType((LogicalType *)local_228), bVar16)) {
          ExpressionBinder::ExchangeNullType((LogicalType *)local_328,(LogicalType *)local_228);
          uVar15 = local_218._0_8_;
          uVar14 = local_228._8_8_;
          local_228._0_2_ = local_328._0_2_;
          local_218._0_8_ = local_328._16_8_;
          local_228._8_8_ = local_328._8_8_;
          local_328._16_8_ = uVar15;
          local_328._8_8_ = uVar14;
          LogicalType::~LogicalType((LogicalType *)local_328);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&(pBVar11->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   (LogicalType *)local_228);
        LogicalType::~LogicalType((LogicalType *)local_228);
        __n_00 = __n_00 + 1;
        pvVar38 = local_350;
        _Var40._M_nxt = local_b8._M_nxt;
        pCVar42 = local_c0;
      } while (local_290 != __n_00);
    }
    pBVar23 = local_358;
    puVar7 = (local_358->left_reorder_idx).
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (local_358->left_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_2b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_358->left_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_2b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_358->left_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_2b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_2b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar7 != (pointer)0x0) {
      operator_delete(puVar7);
    }
    puVar7 = (pBVar23->right_reorder_idx).
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (pBVar23->right_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_2d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (pBVar23->right_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_2d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pBVar23->right_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_2d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_2d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar7 != (pointer)0x0) {
      operator_delete(puVar7);
    }
    if (((byte)pvVar38 & pCVar42 != (pointer)_Var40._M_nxt) == 1) {
      local_350 = &local_360->types;
      local_330 = &local_368->types;
      local_338 = &(local_358->super_BoundQueryNode).types;
      local_290 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                   *)&local_358->left_reorder_exprs;
      local_358 = (type)&local_358->right_reorder_exprs;
      local_298 = local_298 + (local_298 == 0);
      sVar41 = 0;
      do {
        local_348 = sVar41;
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_288,sVar41);
        iVar25 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_268,pvVar24);
        pvVar24 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_288,local_348);
        iVar31 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_68,pvVar24);
        local_370._M_head_impl = (Expression *)0x0;
        local_378._M_head_impl = (Expression *)0x0;
        if (iVar31.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0 ||
            iVar25.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (iVar25.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            pvVar32 = vector<duckdb::LogicalType,_true>::operator[](local_338,local_348);
            LogicalType::LogicalType(&local_98,pvVar32);
            Value::Value((Value *)local_328,&local_98);
            _Var33._M_head_impl = (Expression *)operator_new(0x98);
            Value::Value((Value *)local_228,(Value *)local_328);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)_Var33._M_head_impl,(Value *)local_228);
            Value::~Value((Value *)local_228);
            if (local_370._M_head_impl != (Expression *)0x0) {
              pBVar12 = &(local_370._M_head_impl)->super_BaseExpression;
              local_370._M_head_impl = _Var33._M_head_impl;
              (*pBVar12->_vptr_BaseExpression[1])();
              _Var33._M_head_impl = local_370._M_head_impl;
            }
            local_370._M_head_impl = _Var33._M_head_impl;
            Value::~Value((Value *)local_328);
            LogicalType::~LogicalType(&local_98);
            pvVar32 = vector<duckdb::LogicalType,_true>::operator[]
                                (local_330,
                                 *(size_type *)
                                  ((long)iVar31.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                         ._M_cur + 0x28));
            iVar17 = (*local_368->_vptr_BoundQueryNode[2])();
            binding_02.table_index._4_4_ = extraout_var_02;
            binding_02.table_index._0_4_ = iVar17;
            iVar19 = *(idx_t *)((long)iVar31.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                      ._M_cur + 0x28);
            _Var33._M_head_impl = (Expression *)operator_new(0x70);
            LogicalType::LogicalType((LogicalType *)local_228,pvVar32);
            binding_02.column_index = iVar19;
            BoundColumnRefExpression::BoundColumnRefExpression
                      ((BoundColumnRefExpression *)_Var33._M_head_impl,(LogicalType *)local_228,
                       binding_02,0);
            goto LAB_00ca017a;
          }
          pvVar32 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_350,
                               *(size_type *)
                                ((long)iVar25.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          iVar17 = (*local_360->_vptr_BoundQueryNode[2])();
          binding.table_index._4_4_ = extraout_var;
          binding.table_index._0_4_ = iVar17;
          iVar19 = *(idx_t *)((long)iVar25.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x28);
          _Var33._M_head_impl = (Expression *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_228,pvVar32);
          binding.column_index = iVar19;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)_Var33._M_head_impl,(LogicalType *)local_228,
                     binding,0);
          LogicalType::~LogicalType((LogicalType *)local_228);
          if (local_370._M_head_impl != (Expression *)0x0) {
            pBVar12 = &(local_370._M_head_impl)->super_BaseExpression;
            local_370._M_head_impl = _Var33._M_head_impl;
            (*pBVar12->_vptr_BaseExpression[1])();
            _Var33._M_head_impl = local_370._M_head_impl;
          }
          local_370._M_head_impl = _Var33._M_head_impl;
          pvVar32 = vector<duckdb::LogicalType,_true>::operator[](local_338,local_348);
          LogicalType::LogicalType(&local_80,pvVar32);
          Value::Value((Value *)local_328,&local_80);
          _Var33._M_head_impl = (Expression *)operator_new(0x98);
          Value::Value((Value *)local_228,(Value *)local_328);
          BoundConstantExpression::BoundConstantExpression
                    ((BoundConstantExpression *)_Var33._M_head_impl,(Value *)local_228);
          Value::~Value((Value *)local_228);
          if (local_378._M_head_impl != (Expression *)0x0) {
            pBVar12 = &(local_378._M_head_impl)->super_BaseExpression;
            local_378._M_head_impl = _Var33._M_head_impl;
            (*pBVar12->_vptr_BaseExpression[1])();
            _Var33._M_head_impl = local_378._M_head_impl;
          }
          local_378._M_head_impl = _Var33._M_head_impl;
          Value::~Value((Value *)local_328);
          LogicalType::~LogicalType(&local_80);
          _Var33._M_head_impl = local_378._M_head_impl;
        }
        else {
          pvVar32 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_350,
                               *(size_type *)
                                ((long)iVar25.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          iVar17 = (*local_360->_vptr_BoundQueryNode[2])();
          binding_00.table_index._4_4_ = extraout_var_00;
          binding_00.table_index._0_4_ = iVar17;
          iVar19 = *(idx_t *)((long)iVar25.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x28);
          _Var33._M_head_impl = (Expression *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_228,pvVar32);
          binding_00.column_index = iVar19;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)_Var33._M_head_impl,(LogicalType *)local_228,
                     binding_00,0);
          LogicalType::~LogicalType((LogicalType *)local_228);
          if (local_370._M_head_impl != (Expression *)0x0) {
            pBVar12 = &(local_370._M_head_impl)->super_BaseExpression;
            local_370._M_head_impl = _Var33._M_head_impl;
            (*pBVar12->_vptr_BaseExpression[1])();
            _Var33._M_head_impl = local_370._M_head_impl;
          }
          local_370._M_head_impl = _Var33._M_head_impl;
          pvVar32 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_330,
                               *(size_type *)
                                ((long)iVar31.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          iVar17 = (*local_368->_vptr_BoundQueryNode[2])();
          binding_01.table_index._4_4_ = extraout_var_01;
          binding_01.table_index._0_4_ = iVar17;
          iVar19 = *(idx_t *)((long)iVar31.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x28);
          _Var33._M_head_impl = (Expression *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_228,pvVar32);
          binding_01.column_index = iVar19;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)_Var33._M_head_impl,(LogicalType *)local_228,
                     binding_01,0);
LAB_00ca017a:
          LogicalType::~LogicalType((LogicalType *)local_228);
          if (local_378._M_head_impl != (Expression *)0x0) {
            pBVar12 = &(local_378._M_head_impl)->super_BaseExpression;
            local_378._M_head_impl = _Var33._M_head_impl;
            (*pBVar12->_vptr_BaseExpression[1])();
            _Var33._M_head_impl = local_378._M_head_impl;
          }
        }
        local_378._M_head_impl = _Var33._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  (local_290,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_370);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_358,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_378);
        if ((BoundConstantExpression *)local_378._M_head_impl != (BoundConstantExpression *)0x0) {
          (*(((Expression *)&(local_378._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        if ((BoundConstantExpression *)local_370._M_head_impl != (BoundConstantExpression *)0x0) {
          (*(((Expression *)&(local_370._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        sVar41 = local_348 + 1;
      } while (local_298 != sVar41);
    }
    if (local_2d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_68);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_268);
  }
  else {
    __n = 0;
    while( true ) {
      pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_388);
      pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar18->left);
      if ((ulong)(((long)(pBVar21->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar21->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
          __n) break;
      pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_388);
      pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar18->left);
      pvVar32 = vector<duckdb::LogicalType,_true>::operator[](&pBVar21->types,__n);
      pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_388);
      pBVar21 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar18->right);
      pvVar29 = vector<duckdb::LogicalType,_true>::operator[](&pBVar21->types,__n);
      LogicalType::ForceMaxLogicalType((LogicalType *)local_228,pvVar32,pvVar29);
      if (((local_380.ptr)->can_contain_nulls == false) &&
         (bVar16 = ExpressionBinder::ContainsNullType((LogicalType *)local_228), bVar16)) {
        ExpressionBinder::ExchangeNullType((LogicalType *)local_328,(LogicalType *)local_228);
        uVar15 = local_218._0_8_;
        uVar14 = local_228._8_8_;
        local_228._0_2_ = local_328._0_2_;
        local_218._0_8_ = local_328._16_8_;
        local_228._8_8_ = local_328._8_8_;
        local_328._16_8_ = uVar15;
        local_328._8_8_ = uVar14;
        LogicalType::~LogicalType((LogicalType *)local_328);
      }
      pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_388);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(pBVar18->super_BoundQueryNode).types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (LogicalType *)local_228);
      LogicalType::~LogicalType((LogicalType *)local_228);
      __n = __n + 1;
    }
  }
  local_228._0_8_ = auStack_1f8;
  local_228._8_8_ = &DAT_00000001;
  local_218._0_8_ = (ClientContext *)0x0;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_218._16_4_ = 0x3f800000;
  local_218._24_8_ = (_Hash_node_base *)0x0;
  auStack_1f8._0_8_ = (element_type *)0x0;
  auStack_1f8._8_8_ = auStack_1c0;
  local_1e8 = (ClientContext *)&DAT_00000001;
  local_1e0._M_nxt = (__node_base_ptr)0x0;
  pp_Stack_1d8 = (__buckets_ptr)0x0;
  local_1d0 = 1.0;
  local_1a0._M_buckets = &local_1a0._M_single_bucket;
  local_1c8._M_nxt = (_Hash_node_base *)0x0;
  auStack_1c0 = (undefined1  [8])0x0;
  local_1b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0._M_bucket_count = (size_type)&DAT_00000001;
  local_1a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1a0._M_element_count = 0;
  local_1a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1a0._M_rehash_policy._M_next_resize = 0;
  local_1a0._M_single_bucket = (__node_base_ptr)0x0;
  local_168._0_8_ = local_168 + 0x30;
  local_168._8_8_ = &DAT_00000001;
  local_168._16_8_ = (_Hash_node_base *)0x0;
  local_168._24_8_ = (pointer)0x0;
  local_168._32_4_ = 1.0;
  local_168._40_8_ = (__node_base_ptr)0x0;
  local_168._48_8_ = (_Hash_node_base *)0x0;
  local_130._M_buckets = &local_130._M_single_bucket;
  local_130._M_bucket_count = (size_type)&DAT_00000001;
  local_130._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_130._M_element_count = 0;
  local_130._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8._M_nxt = (_Hash_node_base *)0x0;
  local_f8 = (pointer)0x0;
  puStack_f0 = (pointer)0x0;
  local_130._M_rehash_policy._M_next_resize = 0;
  local_130._M_single_bucket = (__node_base_ptr)0x0;
  if ((local_340->modifiers).
      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_340->modifiers).
      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_388);
    if (pBVar18->setop_type == UNION_BY_NAME) {
      pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_388);
      pBVar34 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar18->left);
      pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_388);
      GatherAliases(pBVar34,(SelectBindState *)local_228,&pBVar18->left_reorder_idx);
      pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_388);
      pBVar34 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar18->right);
      pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_388);
      GatherAliases(pBVar34,(SelectBindState *)local_228,&pBVar18->right_reorder_idx);
    }
    else {
      local_328._0_8_ = (pointer)0x0;
      local_328._8_8_ = (element_type *)0x0;
      local_328._16_8_ = (ClientContext *)0x0;
      prVar39 = (pointer)0x0;
      while (local_268.
             super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
             ._M_impl.super__Vector_impl_data._M_start = prVar39,
            pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                                    *)&local_388),
            prVar39 < (pointer)((long)(pBVar18->super_BoundQueryNode).names.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pBVar18->super_BoundQueryNode).names.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        if (local_328._8_8_ == local_328._16_8_) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_328,
                     (iterator)local_328._8_8_,(unsigned_long *)&local_268);
        }
        else {
          *(pointer *)local_328._8_8_ =
               local_268.
               super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_328._8_8_ = local_328._8_8_ + 8;
        }
        prVar39 = (pointer)((long)&(local_268.
                                    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_data + 1);
      }
      pBVar23 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                             *)&local_388);
      GatherAliases(&pBVar23->super_BoundQueryNode,(SelectBindState *)local_228,
                    (vector<unsigned_long,_true> *)local_328);
      if ((pointer)local_328._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_328._0_8_);
      }
    }
    local_268.
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (reference_wrapper<duckdb::Binder> *)0x0;
    local_268.
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_388);
    pBVar34 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar18->left);
    pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_388);
    pBVar22 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar18->left_binder);
    GatherSetOpBinders(pBVar34,pBVar22,
                       (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_268);
    pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_388);
    pBVar34 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar18->right);
    pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_388);
    pBVar22 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar18->right_binder);
    GatherSetOpBinders(pBVar34,pBVar22,
                       (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_268);
    ::std::
    vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ::vector(&local_b0,&local_268);
    OrderBinder::OrderBinder
              ((OrderBinder *)local_328,
               (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_b0,
               (SelectBindState *)local_228);
    if ((pointer)local_b0.
                 super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.
                      super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pBVar23 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                           *)&local_388);
    PrepareModifiers(local_380.ptr,(OrderBinder *)local_328,local_340,&pBVar23->super_BoundQueryNode
                    );
    if ((undefined1 *)local_328._40_8_ != local_2f0) {
      operator_delete((void *)local_328._40_8_);
    }
    if ((pointer)local_328._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_268.
        super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (reference_wrapper<duckdb::Binder> *)0x0) {
      operator_delete(local_268.
                      super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pBVar23 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)&local_388);
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  iVar19 = pBVar18->setop_index;
  pBVar18 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  pBVar35 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_388);
  BindModifiers(local_380.ptr,&pBVar23->super_BoundQueryNode,iVar19,
                &(pBVar18->super_BoundQueryNode).names,&(pBVar35->super_BoundQueryNode).types,
                (SelectBindState *)local_228);
  _Var13._M_head_impl = local_388._M_head_impl;
  local_388._M_head_impl = (BoundSetOperationNode *)0x0;
  (((enable_shared_from_this<duckdb::Binder> *)
   local_270._M_t.
   super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
   super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl)->__weak_this_).internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var13._M_head_impl;
  if (local_f8 != (pointer)0x0) {
    operator_delete(local_f8);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_130);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_168);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_1a0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_1b8);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(auStack_1f8 + 8));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_228);
  if (local_388._M_head_impl != (BoundSetOperationNode *)0x0) {
    (*((local_388._M_head_impl)->super_BoundQueryNode)._vptr_BoundQueryNode[1])();
  }
  return (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
         local_270._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
         .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundQueryNode> Binder::BindNode(SetOperationNode &statement) {
	auto result = make_uniq<BoundSetOperationNode>();
	result->setop_type = statement.setop_type;
	result->setop_all = statement.setop_all;

	// first recursively visit the set operations
	// both the left and right sides have an independent BindContext and Binder
	D_ASSERT(statement.left);
	D_ASSERT(statement.right);

	result->setop_index = GenerateTableIndex();

	result->left_binder = Binder::CreateBinder(context, this);
	result->left_binder->can_contain_nulls = true;
	result->left = result->left_binder->BindNode(*statement.left);
	result->right_binder = Binder::CreateBinder(context, this);
	result->right_binder->can_contain_nulls = true;
	result->right = result->right_binder->BindNode(*statement.right);

	result->names = result->left->names;

	// move the correlated expressions from the child binders to this binder
	MoveCorrelatedExpressions(*result->left_binder);
	MoveCorrelatedExpressions(*result->right_binder);

	// now both sides have been bound we can resolve types
	if (result->setop_type != SetOperationType::UNION_BY_NAME &&
	    result->left->types.size() != result->right->types.size()) {
		throw BinderException("Set operations can only apply to expressions with the "
		                      "same number of result columns");
	}

	if (result->setop_type == SetOperationType::UNION_BY_NAME) {
		BuildUnionByNameInfo(context, *result, can_contain_nulls);
	} else {
		// figure out the types of the setop result by picking the max of both
		for (idx_t i = 0; i < result->left->types.size(); i++) {
			auto result_type = LogicalType::ForceMaxLogicalType(result->left->types[i], result->right->types[i]);
			if (!can_contain_nulls) {
				if (ExpressionBinder::ContainsNullType(result_type)) {
					result_type = ExpressionBinder::ExchangeNullType(result_type);
				}
			}
			result->types.push_back(result_type);
		}
	}

	SelectBindState bind_state;
	if (!statement.modifiers.empty()) {
		// handle the ORDER BY/DISTINCT clauses

		// we recursively visit the children of this node to extract aliases and expressions that can be referenced
		// in the ORDER BY

		if (result->setop_type == SetOperationType::UNION_BY_NAME) {
			GatherAliases(*result->left, bind_state, result->left_reorder_idx);
			GatherAliases(*result->right, bind_state, result->right_reorder_idx);
		} else {
			vector<idx_t> reorder_idx;
			for (idx_t i = 0; i < result->names.size(); i++) {
				reorder_idx.push_back(i);
			}
			GatherAliases(*result, bind_state, reorder_idx);
		}
		// now we perform the actual resolution of the ORDER BY/DISTINCT expressions
		vector<reference<Binder>> binders;
		GatherSetOpBinders(*result->left, *result->left_binder, binders);
		GatherSetOpBinders(*result->right, *result->right_binder, binders);
		OrderBinder order_binder(binders, bind_state);
		PrepareModifiers(order_binder, statement, *result);
	}

	// finally bind the types of the ORDER/DISTINCT clause expressions
	BindModifiers(*result, result->setop_index, result->names, result->types, bind_state);
	return std::move(result);
}